

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_filter_bank_analysis.cc
# Opt level: O3

bool __thiscall
sptk::MelFilterBankAnalysis::Run
          (MelFilterBankAnalysis *this,vector<double,_std::allocator<double>_> *power_spectrum,
          vector<double,_std::allocator<double>_> *filter_bank_output,double *energy)

{
  uint uVar1;
  pointer piVar2;
  pointer pdVar3;
  int iVar4;
  double *pdVar5;
  pointer pdVar6;
  bool bVar7;
  pointer pdVar8;
  long lVar9;
  double dVar10;
  
  if (this->is_valid_ == true) {
    bVar7 = false;
    if ((filter_bank_output != (vector<double,_std::allocator<double>_> *)0x0) &&
       (bVar7 = false,
       (long)(power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3 == (long)(this->fft_length_ / 2 + 1))) {
      pdVar8 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if ((long)pdVar6 - (long)pdVar8 >> 3 != (long)this->num_channel_) {
        std::vector<double,_std::allocator<double>_>::resize
                  (filter_bank_output,(long)this->num_channel_);
        pdVar8 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (filter_bank_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      if (pdVar8 != pdVar6) {
        memset(pdVar8,0,((long)pdVar6 + (-8 - (long)pdVar8) & 0xfffffffffffffff8U) + 8);
      }
      lVar9 = (long)this->lower_bin_index_;
      if (this->lower_bin_index_ < this->upper_bin_index_) {
        piVar2 = (this->channel_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->channel_weights_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar3 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          uVar1 = piVar2[lVar9];
          dVar10 = pdVar3[lVar9];
          if (this->use_power_ == false) {
            if (dVar10 < 0.0) {
              dVar10 = sqrt(dVar10);
            }
            else {
              dVar10 = SQRT(dVar10);
            }
          }
          if (0 < (int)uVar1) {
            pdVar8[(ulong)uVar1 - 1] = pdVar6[lVar9] * dVar10 + pdVar8[(ulong)uVar1 - 1];
          }
          iVar4 = this->num_channel_;
          if ((int)uVar1 < iVar4) {
            pdVar8[(int)uVar1] = dVar10 * (1.0 - pdVar6[lVar9]) + pdVar8[(int)uVar1];
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->upper_bin_index_);
      }
      else {
        iVar4 = this->num_channel_;
      }
      if (0 < iVar4) {
        lVar9 = 0;
        do {
          dVar10 = this->floor_;
          if (this->floor_ <= pdVar8[lVar9]) {
            dVar10 = pdVar8[lVar9];
          }
          dVar10 = log(dVar10);
          pdVar8[lVar9] = dVar10;
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->num_channel_);
      }
      bVar7 = true;
      if (energy != (double *)0x0) {
        pdVar5 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar8 = (power_spectrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        dVar10 = *pdVar5 + pdVar8[-1];
        while (pdVar5 = pdVar5 + 1, pdVar5 != pdVar8 + -1) {
          dVar10 = dVar10 + *pdVar5 + *pdVar5;
        }
        dVar10 = log(dVar10 / (double)this->fft_length_);
        *energy = dVar10;
      }
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool MelFilterBankAnalysis::Run(const std::vector<double>& power_spectrum,
                                std::vector<double>* filter_bank_output,
                                double* energy) const {
  // Check inputs.
  if (!is_valid_ ||
      power_spectrum.size() != static_cast<std::size_t>(fft_length_ / 2 + 1) ||
      NULL == filter_bank_output) {
    return false;
  }

  // Prepare memories.
  if (filter_bank_output->size() != static_cast<std::size_t>(num_channel_)) {
    filter_bank_output->resize(num_channel_);
  }

  std::fill(filter_bank_output->begin(), filter_bank_output->end(), 0.0);

  // Apply mel-filter-banks.
  const int* map(&(channel_indices_[0]));
  const double* w(&(channel_weights_[0]));
  const double* input(&(power_spectrum[0]));
  double* output(&((*filter_bank_output)[0]));
  for (int k(lower_bin_index_); k < upper_bin_index_; ++k) {
    const int m(map[k]);
    const double x(use_power_ ? input[k] : std::sqrt(input[k]));
    if (0 < m) {
      output[m - 1] += x * w[k];
    }
    if (m < num_channel_) {
      output[m] += x * (1.0 - w[k]);
    }
  }

  // Apply logarithm function.
  for (int m(0); m < num_channel_; ++m) {
    if (output[m] < floor_) output[m] = floor_;
    output[m] = std::log(output[m]);
  }

  if (NULL != energy) {
    const double sum(
        std::accumulate(power_spectrum.begin() + 1, power_spectrum.end() - 1,
                        power_spectrum.front() + power_spectrum.back(),
                        [](double a, double x) { return a + 2.0 * x; }));
    *energy = std::log(sum / fft_length_);
  }

  return true;
}